

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

BOOL __thiscall
Js::CustomExternalWrapperObject::SetPropertyTrap
          (CustomExternalWrapperObject *this,Var receiver,SetPropertyTrapKind setPropertyTrapKind,
          JavascriptString *propertyNameString,Var newValue,ScriptContext *requestContext,
          PropertyOperationFlags propertyOperationFlags,PropertyValueInfo *info)

{
  anon_class_32_4_5c606122 fn_00;
  anon_class_16_2_34cffd66 getPropertyName_00;
  BOOL BVar1;
  anon_class_32_4_5c606122 fn;
  anon_class_16_2_34cffd66 getPropertyName;
  ScriptContext *requestContext_local;
  Var newValue_local;
  JavascriptString *propertyNameString_local;
  Var pvStack_20;
  SetPropertyTrapKind setPropertyTrapKind_local;
  Var receiver_local;
  CustomExternalWrapperObject *this_local;
  
  getPropertyName_00.this = this;
  getPropertyName_00.propertyNameString = (JavascriptString **)&newValue_local;
  fn_00.this = this;
  fn_00.newValue = &requestContext_local;
  fn_00.propertyNameString = (JavascriptString **)&newValue_local;
  fn_00.propertyOperationFlags = &propertyOperationFlags;
  requestContext_local = (ScriptContext *)newValue;
  newValue_local = propertyNameString;
  propertyNameString_local._4_4_ = setPropertyTrapKind;
  pvStack_20 = receiver;
  receiver_local = this;
  BVar1 = SetPropertyTrap<Js::CustomExternalWrapperObject::SetPropertyTrap(void*,Js::CustomExternalWrapperObject::SetPropertyTrapKind,Js::JavascriptString*,void*,Js::ScriptContext*,Js::PropertyOperationFlags,Js::PropertyValueInfo*)::__0,Js::CustomExternalWrapperObject::SetPropertyTrap(void*,Js::CustomExternalWrapperObject::SetPropertyTrapKind,Js::JavascriptString*,void*,Js::ScriptContext*,Js::PropertyOperationFlags,Js::PropertyValueInfo*)::__1>
                    (this,receiver,setPropertyTrapKind,getPropertyName_00,newValue,requestContext,
                     propertyOperationFlags,0,fn_00,info);
  return BVar1;
}

Assistant:

BOOL CustomExternalWrapperObject::SetPropertyTrap(Js::Var receiver, SetPropertyTrapKind setPropertyTrapKind, Js::JavascriptString * propertyNameString, Js::Var newValue, Js::ScriptContext * requestContext, Js::PropertyOperationFlags propertyOperationFlags, Js::PropertyValueInfo* info)
{
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        const Js::PropertyRecord* propertyRecord;
        propertyNameString->GetPropertyRecord(&propertyRecord);
        return GetName(requestContext, propertyRecord->GetPropertyId(), isPropertyNameNumeric, propertyNameNumericValue);
    };
    auto fn = [&]()->BOOL
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        newValue = Js::CrossSite::MarshalVar(this->GetScriptContext(), newValue);
        return DynamicObject::SetProperty(propertyNameString, newValue, propertyOperationFlags, nullptr);
    };
    return SetPropertyTrap(receiver, setPropertyTrapKind, getPropertyName, newValue, requestContext, propertyOperationFlags, FALSE, fn, info);
}